

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_dir.cpp
# Opt level: O2

void just_test_test_case_f_test_can_create_files_in_temp_dir(void)

{
  allocator<char> local_291;
  string local_290 [32];
  string p;
  assert_msg local_250;
  directory d;
  ofstream f;
  byte abStack_1e8 [480];
  
  just::temp::directory::directory((directory *)&d._path);
  std::operator+(&p,&d._path,"/test.txt");
  std::ofstream::ofstream(&f,p._M_dataplus._M_p,_S_out);
  std::__cxx11::string::string<std::allocator<char>>
            (local_290,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/sabel83[P]just/libs/temp/test/test_dir.cpp"
             ,&local_291);
  std::__cxx11::string::string((string *)&local_250,local_290);
  local_250._line = 0x4b;
  just::test::assert_msg::operator()(&local_250,(abStack_1e8[*(long *)(_f + -0x18)] & 5) == 0);
  std::__cxx11::string::~string((string *)&local_250);
  std::__cxx11::string::~string(local_290);
  std::ofstream::~ofstream(&f);
  std::__cxx11::string::~string((string *)&p);
  just::temp::directory::~directory(&d);
  return;
}

Assistant:

JUST_TEST_CASE(test_can_create_files_in_temp_dir)
{
  const temp::directory d;

  const std::string p = d.path() + "/test.txt";
  std::ofstream f(p.c_str());

  JUST_ASSERT(!f.fail());
}